

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int LoadEXRImageFromMemory
              (EXRImage *exr_image,EXRHeader *exr_header,uchar *memory,size_t size,char **err)

{
  uchar *puVar1;
  int iVar2;
  long *plVar3;
  ulong uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  pointer pvVar8;
  int iVar9;
  uchar *puVar10;
  char *pcVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  char *pcVar15;
  ulong uVar16;
  _Alloc_hider _Var17;
  ulong uVar18;
  OffsetData offset_data;
  size_type __dnew;
  vector<int,_std::allocator<int>_> num_y_tiles;
  vector<int,_std::allocator<int>_> num_x_tiles;
  tinyexr *this;
  undefined1 local_a8 [16];
  string local_98;
  uchar *local_78;
  int local_6c;
  vector<int,_std::allocator<int>_> local_68;
  vector<int,_std::allocator<int>_> local_48;
  
  if ((memory == (uchar *)0x0 || exr_image == (EXRImage *)0x0) || size < 8) {
    pcVar15 = "Invalid argument for LoadEXRImageFromMemory";
    pcVar11 = "";
  }
  else {
    if ((ulong)exr_header->header_len != 0) {
      local_78 = memory + (ulong)exr_header->header_len + 8;
      if (size < 9) {
        local_98._M_dataplus._M_p = (pointer)0x26;
        pvVar8 = (pointer)std::__cxx11::string::_M_create
                                    ((ulong *)&stack0xffffffffffffff48,(ulong)(local_a8 + 0x10));
        local_a8._0_8_ = local_98._M_dataplus._M_p;
        (pvVar8->
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x2064696c61766e49;
        (pvVar8->
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x746e656d75677261;
        (pvVar8->
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x63654420726f6620;
        pvVar8[1].
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x6d4952584565646f;
        builtin_strncpy((char *)((long)&pvVar8[1].
                                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 6),"Image().",8)
        ;
        local_98._M_dataplus._M_p
        [(long)&pvVar8->
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ] = '\0';
        if (err != (char **)0x0) {
          pcVar11 = strdup((char *)pvVar8);
          *err = pcVar11;
        }
        if (pvVar8 == (pointer)local_a8) {
          return -3;
        }
        goto LAB_001c7087;
      }
      iVar7 = exr_header->compression_type;
      uVar16 = 0x10;
      if ((iVar7 != 3) && (iVar7 != 0x80)) {
        if (iVar7 == 4) {
          uVar16 = 0x20;
        }
        else {
          uVar16 = 1;
        }
      }
      iVar7 = (exr_header->data_window).max_x;
      iVar2 = (exr_header->data_window).min_x;
      iVar9 = iVar7 - iVar2;
      if ((iVar7 < iVar2) || (iVar9 == 0x7fffffff)) {
        local_98._M_dataplus._M_p = (pointer)0x18;
        pvVar8 = (pointer)std::__cxx11::string::_M_create
                                    ((ulong *)&stack0xffffffffffffff48,(ulong)(local_a8 + 0x10));
        (pvVar8->
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x2064696c61766e49;
        (pvVar8->
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x6469772061746164;
        (pvVar8->
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x65756c6176206874;
      }
      else {
        iVar7 = (exr_header->data_window).max_y;
        iVar2 = (exr_header->data_window).min_y;
        iVar6 = iVar7 - iVar2;
        if ((iVar2 <= iVar7) && (iVar6 != 0x7fffffff)) {
          if (iVar9 < 0x800000) {
            if (iVar6 < 0x800000) {
              if (exr_header->tiled == 0) {
                local_a8._0_8_ = (pointer)0x0;
                local_a8._8_8_ = (pointer)0x0;
                this = (tinyexr *)0x0;
                uVar14 = (ulong)exr_header->chunk_count;
                if ((long)uVar14 < 1) {
                  uVar14 = (ulong)(long)(iVar6 + 1) / uVar16;
                  uVar14 = uVar14 + (uVar16 * uVar14 < (ulong)(long)(iVar6 + 1));
                  tinyexr::InitSingleResolutionOffsets
                            ((OffsetData *)&stack0xffffffffffffff48,uVar14);
                }
                else {
                  tinyexr::InitSingleResolutionOffsets
                            ((OffsetData *)&stack0xffffffffffffff48,uVar14);
                }
LAB_001c73a4:
                puVar1 = local_78;
                if ((exr_header->tiled == 0) && (uVar14 != 0)) {
                  plVar3 = *(long **)this;
                  lVar13 = 0;
                  uVar16 = uVar14;
                  do {
                    lVar12 = lVar13;
                    if (memory + size <= local_78 + lVar12 + 8) {
                      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)(local_a8 + 0x10),
                                 "Insufficient data size in offset table.","");
                      goto LAB_001c75c0;
                    }
                    if (size <= *(ulong *)(local_78 + lVar12)) {
                      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)(local_a8 + 0x10),
                                 "Invalid offset value in DecodeEXRImage.","");
                      goto LAB_001c75c0;
                    }
                    *(ulong *)(*plVar3 + lVar12) = *(ulong *)(local_78 + lVar12);
                    lVar13 = lVar12 + 8;
                    uVar16 = uVar16 - 1;
                  } while (uVar16 != 0);
                  puVar1 = local_78 + lVar13;
                  uVar16 = 0;
                  do {
                    if (*(long *)(*plVar3 + uVar16 * 8) == 0) {
                      if ((size <= local_78 + (lVar13 - (long)memory) + 8) ||
                         (uVar16 = (ulong)*(uint *)(local_78 + lVar12 + 0xc), size <= uVar16))
                      goto LAB_001c759f;
                      local_78 = local_78 + (lVar13 - (long)memory);
                      puVar10 = puVar1;
                      uVar4 = 1;
                      goto LAB_001c7565;
                    }
                    uVar16 = uVar16 + 1;
                  } while (uVar14 != uVar16);
                }
                goto LAB_001c73ab;
              }
              if (exr_header->tile_size_x < 0x800001) {
                if (exr_header->tile_size_y < 0x800001) {
                  local_a8._0_8_ = (pointer)0x0;
                  local_a8._8_8_ = (pointer)0x0;
                  this = (tinyexr *)0x0;
                  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  tinyexr::PrecalculateTileInfo(&local_48,&local_68,exr_header);
                  iVar7 = tinyexr::InitTileOffsets
                                    ((OffsetData *)&stack0xffffffffffffff48,exr_header,&local_48,
                                     &local_68);
                  if (exr_header->chunk_count != iVar7 && 0 < exr_header->chunk_count) {
                    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)(local_a8 + 0x10),"Invalid offset table size.","");
                    _Var17._M_p = local_98._M_dataplus._M_p;
                    if (err != (char **)0x0) {
                      pcVar11 = strdup(local_98._M_dataplus._M_p);
                      *err = pcVar11;
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)_Var17._M_p != &local_98.field_2) {
                      operator_delete(_Var17._M_p);
                    }
                    if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start);
                    }
                    _Var17._M_p = (pointer)local_48.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0) goto LAB_001c75dd;
                    goto LAB_001c75e2;
                  }
                  local_6c = iVar7;
                  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0) {
                    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
                  }
                  iVar7 = tinyexr::ReadOffsets
                                    ((OffsetData *)&stack0xffffffffffffff48,memory,&local_78,size,
                                     err);
                  if (iVar7 != 0) goto LAB_001c75e7;
                  uVar14 = (ulong)local_6c;
                  bVar5 = tinyexr::IsAnyOffsetsAreInvalid(this,(OffsetData *)0x0);
                  if (bVar5) {
                    tinyexr::ReconstructTileOffsets
                              ((OffsetData *)&stack0xffffffffffffff48,exr_header,memory,local_78,
                               (ulong)(exr_header->multipart != 0),exr_header->non_image != 0,
                               (bool)SUB81(this,0));
                  }
                  goto LAB_001c73a4;
                }
                pcVar15 = "tile height too large.";
                pcVar11 = "";
              }
              else {
                pcVar15 = "tile width too large.";
                pcVar11 = "";
              }
            }
            else {
              pcVar15 = "data height too large.";
              pcVar11 = "";
            }
          }
          else {
            pcVar15 = "data width too large.";
            pcVar11 = "";
          }
          pvVar8 = (pointer)local_a8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&stack0xffffffffffffff48,pcVar15,pcVar11);
          if (err != (char **)0x0) {
            pcVar11 = strdup((char *)pvVar8);
            *err = pcVar11;
          }
          if (pvVar8 == (pointer)local_a8) {
            return -4;
          }
          goto LAB_001c714e;
        }
        local_98._M_dataplus._M_p = (pointer)0x19;
        pvVar8 = (pointer)std::__cxx11::string::_M_create
                                    ((ulong *)&stack0xffffffffffffff48,(ulong)(local_a8 + 0x10));
        builtin_strncpy((char *)((long)&(pvVar8->
                                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish + 1),"ata heig",
                        8);
        builtin_strncpy((char *)((long)&(pvVar8->
                                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_end_of_storage + 1),
                        "ht value",8);
        (pvVar8->
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x2064696c61766e49;
        (pvVar8->
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x6965682061746164;
      }
      local_98._M_dataplus._M_p
      [(long)&pvVar8->
              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ] = '\0';
      local_a8._0_8_ = local_98._M_dataplus._M_p;
      if (err != (char **)0x0) {
        pcVar11 = strdup((char *)pvVar8);
        *err = pcVar11;
      }
      if (pvVar8 == (pointer)local_a8) {
        return -4;
      }
LAB_001c714e:
      operator_delete(pvVar8);
      return -4;
    }
    pcVar15 = "EXRHeader variable is not initialized.";
    pcVar11 = "";
  }
  pvVar8 = (pointer)local_a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xffffffffffffff48,pcVar15,pcVar11);
  if (err != (char **)0x0) {
    pcVar11 = strdup((char *)pvVar8);
    *err = pcVar11;
  }
  if (pvVar8 == (pointer)local_a8) {
    return -3;
  }
LAB_001c7087:
  operator_delete(pvVar8);
  return -3;
  while( true ) {
    puVar10 = puVar10 + ((int)uVar16 + 8);
    local_78 = puVar10 + -(long)memory;
    if (size <= local_78 + 8) break;
    uVar16 = (ulong)*(uint *)(puVar10 + 4);
    uVar4 = uVar18 + 1;
    if (size <= uVar16) break;
LAB_001c7565:
    uVar18 = uVar4;
    *(uchar **)(*plVar3 + -8 + uVar18 * 8) = local_78;
    if (uVar14 == uVar18) break;
  }
  if (uVar18 < uVar14) {
LAB_001c759f:
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    local_78 = puVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_a8 + 0x10),"Cannot reconstruct lineOffset table in DecodeEXRImage.",
               "");
LAB_001c75c0:
    _Var17._M_p = local_98._M_dataplus._M_p;
    if (err != (char **)0x0) {
      pcVar11 = strdup(local_98._M_dataplus._M_p);
      *err = pcVar11;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var17._M_p != &local_98.field_2) {
LAB_001c75dd:
      operator_delete(_Var17._M_p);
    }
LAB_001c75e2:
    iVar7 = -4;
    goto LAB_001c75e7;
  }
LAB_001c73ab:
  local_78 = puVar1;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  iVar7 = tinyexr::DecodeChunk
                    (exr_image,exr_header,(OffsetData *)&stack0xffffffffffffff48,memory,size,
                     (string *)(local_a8 + 0x10));
  if (iVar7 != 0) {
    if ((err != (char **)0x0) && (local_98._M_string_length != 0)) {
      pcVar11 = strdup(local_98._M_dataplus._M_p);
      *err = pcVar11;
    }
    FreeEXRImage(exr_image);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
LAB_001c75e7:
  std::
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::~vector((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
             *)&stack0xffffffffffffff48);
  return iVar7;
}

Assistant:

int LoadEXRImageFromMemory(EXRImage *exr_image, const EXRHeader *exr_header,
                           const unsigned char *memory, const size_t size,
                           const char **err) {
  if (exr_image == NULL || memory == NULL ||
      (size < tinyexr::kEXRVersionSize)) {
    tinyexr::SetErrorMessage("Invalid argument for LoadEXRImageFromMemory",
                             err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  if (exr_header->header_len == 0) {
    tinyexr::SetErrorMessage("EXRHeader variable is not initialized.", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  const unsigned char *head = memory;
  const unsigned char *marker = reinterpret_cast<const unsigned char *>(
      memory + exr_header->header_len +
      8);  // +8 for magic number + version header.
  return tinyexr::DecodeEXRImage(exr_image, exr_header, head, marker, size,
                                 err);
}